

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O2

void __thiscall
MeasurementToString_caseSensitive_Test::TestBody(MeasurementToString_caseSensitive_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer ppVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  _Alloc_hider _Var4;
  int iVar5;
  uint64_t uVar6;
  precise_measurement *measure;
  string *in_RCX;
  size_type sVar7;
  long lVar8;
  char *in_R9;
  pointer ppVar9;
  initializer_list<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  AssertionResult gtest_ar_;
  string case_insensitive_plural_str;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2f0;
  AssertionResult gtest_ar__6;
  precise_measurement case_insensitive_singular;
  precise_measurement case_insensitive_plural;
  precise_measurement round_trip;
  precise_measurement case_insensitive_singular_caps;
  precise_measurement case_insensitive_plural_caps;
  precise_measurement case_sensitive_singular;
  AssertHelper local_230;
  string plural;
  string plural_caps;
  string singular_caps;
  string local_1c8;
  string local_1a8;
  precise_measurement case_sensitive_plural;
  string singular;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (TestBody()::twoc_units_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::twoc_units_abi_cxx11_);
    if (iVar5 != 0) {
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_true>
                ((pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&singular,(unit *)&units::lb,(char (*) [3])0x16e04f);
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_true>(&local_148,(unit *)&units::oz,(char (*) [3])0x16dad7);
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_true>(&local_120,(unit *)&units::yd,(char (*) [3])0x16c8f5);
      plural._M_dataplus._M_p = (pointer)0x33a7814ac;
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<units::unit,_const_char_(&)[3],_true>(&local_f8,(unit *)&plural,(char (*) [3])0x16e271)
      ;
      in_RCX = &singular_caps;
      __l._M_len = 4;
      __l._M_array = (iterator)&singular;
      std::
      vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&TestBody()::twoc_units_abi_cxx11_,__l,(allocator_type *)in_RCX);
      lVar8 = 0x80;
      do {
        std::__cxx11::string::~string((string *)((long)&singular._M_dataplus._M_p + lVar8));
        lVar8 = lVar8 + -0x28;
      } while (lVar8 != -0x20);
      __cxa_atexit(std::
                   vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~vector,&TestBody()::twoc_units_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::twoc_units_abi_cxx11_);
    }
  }
  ppVar1 = TestBody()::twoc_units_abi_cxx11_.
           super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar9 = TestBody()::twoc_units_abi_cxx11_.
                super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar1; ppVar9 = ppVar9 + 1) {
    std::__cxx11::string::string((string *)&plural,"17 ",(allocator *)&singular_caps);
    __rhs = &ppVar9->second;
    std::operator+(&singular,&plural,__rhs);
    std::__cxx11::string::~string((string *)&plural);
    std::__cxx11::string::string((string *)&plural,(string *)&singular);
    std::__cxx11::string::push_back((char)&plural);
    std::__cxx11::string::string((string *)&singular_caps,(string *)&singular);
    sVar3 = singular._M_string_length;
    _Var4 = singular._M_dataplus;
    _Var2 = singular_caps._M_dataplus;
    for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
      iVar5 = toupper((int)_Var4._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar5;
    }
    std::__cxx11::string::string((string *)&plural_caps,(string *)&plural);
    _Var4 = plural_caps._M_dataplus;
    sVar3 = plural._M_string_length;
    _Var2 = plural._M_dataplus;
    for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
      iVar5 = toupper((int)_Var2._M_p[sVar7]);
      _Var4._M_p[sVar7] = (char)iVar5;
    }
    std::__cxx11::string::string((string *)&local_1a8,(string *)&plural);
    uVar6 = units::getDefaultFlags();
    units::measurement_from_string(&case_sensitive_plural,&local_1a8,uVar6);
    std::__cxx11::string::~string((string *)&local_1a8);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (((uint)(ppVar9->first).base_units_ ^ (uint)case_sensitive_plural.units_.base_units_) &
         0xfffffff) == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&case_sensitive_singular);
      std::operator<<((ostream *)((long)case_sensitive_singular.value_ + 0x10),"error with ");
      std::operator<<((ostream *)((long)case_sensitive_singular.value_ + 0x10),(string *)__rhs);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&case_insensitive_plural_str,(internal *)&gtest_ar_,
                 (AssertionResult *)"case_sensitive_plural.units().has_same_base(up.first)","false",
                 "true",in_R9);
      in_RCX = (string *)0xa3;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&case_insensitive_plural,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xa3,case_insensitive_plural_str._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&case_insensitive_plural,(Message *)&case_sensitive_singular);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&case_insensitive_plural);
      std::__cxx11::string::~string((string *)&case_insensitive_plural_str);
      if (case_sensitive_singular.value_ != 0.0) {
        (**(code **)(*(long *)case_sensitive_singular.value_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string((string *)&local_1c8,(string *)&singular);
    uVar6 = units::getDefaultFlags();
    units::measurement_from_string(&case_sensitive_singular,&local_1c8,uVar6);
    std::__cxx11::string::~string((string *)&local_1c8);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (((uint)(ppVar9->first).base_units_ ^ (uint)case_sensitive_singular.units_.base_units_) &
         0xfffffff) == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&case_insensitive_plural);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&case_insensitive_plural_str,(internal *)&gtest_ar_,
                 (AssertionResult *)"case_sensitive_singular.units().has_same_base(up.first)",
                 "false","true",in_R9);
      in_RCX = (string *)0xa7;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&case_insensitive_singular,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xa7,case_insensitive_plural_str._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&case_insensitive_singular,(Message *)&case_insensitive_plural);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&case_insensitive_singular);
      std::__cxx11::string::~string((string *)&case_insensitive_plural_str);
      if (case_insensitive_plural.value_ != 0.0) {
        (**(code **)(*(long *)case_insensitive_plural.value_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string((string *)&local_50,(string *)&plural);
    units::measurement_from_string(&case_insensitive_plural,&local_50,0x200);
    std::__cxx11::string::~string((string *)&local_50);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (((uint)(ppVar9->first).base_units_ ^ (uint)case_insensitive_plural.units_.base_units_) &
         0xfffffff) == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&case_insensitive_singular);
      std::operator<<((ostream *)((long)case_insensitive_singular.value_ + 0x10),(string *)__rhs);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&case_insensitive_plural_str,(internal *)&gtest_ar_,
                 (AssertionResult *)"case_insensitive_plural.units().has_same_base(up.first)",
                 "false","true",in_R9);
      in_RCX = (string *)0xad;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&case_insensitive_plural_caps,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xad,case_insensitive_plural_str._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&case_insensitive_plural_caps,(Message *)&case_insensitive_singular
                );
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&case_insensitive_plural_caps);
      std::__cxx11::string::~string((string *)&case_insensitive_plural_str);
      if (case_insensitive_singular.value_ != 0.0) {
        (**(code **)(*(long *)case_insensitive_singular.value_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string((string *)&local_70,(string *)&singular);
    units::measurement_from_string(&case_insensitive_singular,&local_70,0x200);
    std::__cxx11::string::~string((string *)&local_70);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (((uint)(ppVar9->first).base_units_ ^ (uint)case_insensitive_singular.units_.base_units_) &
         0xfffffff) == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&case_insensitive_plural_caps);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&case_insensitive_plural_str,(internal *)&gtest_ar_,
                 (AssertionResult *)"case_insensitive_singular.units().has_same_base(up.first)",
                 "false","true",in_R9);
      in_RCX = (string *)0xb3;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&case_insensitive_singular_caps,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xb3,case_insensitive_plural_str._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&case_insensitive_singular_caps,
                 (Message *)&case_insensitive_plural_caps);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&case_insensitive_singular_caps);
      std::__cxx11::string::~string((string *)&case_insensitive_plural_str);
      if (case_insensitive_plural_caps.value_ != 0.0) {
        (**(code **)(*(long *)case_insensitive_plural_caps.value_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string((string *)&local_90,(string *)&plural_caps);
    units::measurement_from_string(&case_insensitive_plural_caps,&local_90,0x200);
    std::__cxx11::string::~string((string *)&local_90);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (((uint)(ppVar9->first).base_units_ ^ (uint)case_insensitive_plural_caps.units_.base_units_
          ) & 0xfffffff) == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&case_insensitive_singular_caps);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&case_insensitive_plural_str,(internal *)&gtest_ar_,
                 (AssertionResult *)"case_insensitive_plural_caps.units().has_same_base(up.first)",
                 "false","true",in_R9);
      in_RCX = (string *)0xba;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&round_trip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xba,case_insensitive_plural_str._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&round_trip,(Message *)&case_insensitive_singular_caps);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&round_trip);
      std::__cxx11::string::~string((string *)&case_insensitive_plural_str);
      if (case_insensitive_singular_caps.value_ != 0.0) {
        (**(code **)(*(long *)case_insensitive_singular_caps.value_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string((string *)&local_b0,(string *)&singular_caps);
    units::measurement_from_string(&case_insensitive_singular_caps,&local_b0,0x200);
    std::__cxx11::string::~string((string *)&local_b0);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (((uint)(ppVar9->first).base_units_ ^
          (uint)case_insensitive_singular_caps.units_.base_units_) & 0xfffffff) == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&round_trip);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&case_insensitive_plural_str,(internal *)&gtest_ar_,
                 (AssertionResult *)"case_insensitive_singular_caps.units().has_same_base(up.first)"
                 ,"false","true",in_R9);
      in_RCX = (string *)0xc0;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__6,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xc0,case_insensitive_plural_str._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__6,(Message *)&round_trip);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6);
      std::__cxx11::string::~string((string *)&case_insensitive_plural_str);
      if (round_trip.value_ != 0.0) {
        (**(code **)(*(long *)round_trip.value_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    measure = (precise_measurement *)units::getDefaultFlags();
    units::to_string_abi_cxx11_
              (&case_insensitive_plural_str,(units *)&case_insensitive_plural,measure,
               (uint64_t)in_RCX);
    std::__cxx11::string::string((string *)&local_d0,(string *)&case_insensitive_plural_str);
    units::measurement_from_string(&round_trip,&local_d0,0x200);
    std::__cxx11::string::~string((string *)&local_d0);
    gtest_ar__6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__6.success_ =
         (((uint)(ppVar9->first).base_units_ ^ (uint)round_trip.units_.base_units_) & 0xfffffff) ==
         0;
    if (!gtest_ar__6.success_) {
      testing::Message::Message((Message *)&local_2f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__6,
                 (AssertionResult *)"round_trip.units().has_same_base(up.first)","false","true",
                 in_R9);
      in_RCX = (string *)0xc7;
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,199,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (local_2f0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_2f0._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__6.message_);
    std::__cxx11::string::~string((string *)&case_insensitive_plural_str);
    std::__cxx11::string::~string((string *)&plural_caps);
    std::__cxx11::string::~string((string *)&singular_caps);
    std::__cxx11::string::~string((string *)&plural);
    std::__cxx11::string::~string((string *)&singular);
  }
  return;
}

Assistant:

TEST(MeasurementToString, caseSensitive)
{
    static const std::vector<std::pair<unit, std::string>> twoc_units{
        {lb, "lb"},
        {oz, "oz"},
        {yd, "yd"},
        {unit_cast(precise::us::quart), "qt"}};

    for (const auto& up : twoc_units) {
        std::string singular = std::string("17 ") + up.second;
        std::string plural = singular;
        plural.push_back('s');

        std::string singular_caps = singular;
        std::transform(
            singular.begin(), singular.end(), singular_caps.begin(), ::toupper);

        std::string plural_caps = plural;
        std::transform(
            plural.begin(), plural.end(), plural_caps.begin(), ::toupper);

        precise_measurement case_sensitive_plural =
            measurement_from_string(plural);
        // true
        EXPECT_TRUE(case_sensitive_plural.units().has_same_base(up.first))
            << "error with " << up.second;
        precise_measurement case_sensitive_singular =
            measurement_from_string(singular);
        EXPECT_TRUE(case_sensitive_singular.units().has_same_base(up.first));

        // Case insensitive string conversion
        precise_measurement case_insensitive_plural =
            measurement_from_string(plural, case_insensitive);
        // true
        EXPECT_TRUE(case_insensitive_plural.units().has_same_base(up.first))
            << up.second;

        units::precise_measurement case_insensitive_singular =
            measurement_from_string(singular, case_insensitive);
        // false
        EXPECT_TRUE(case_insensitive_singular.units().has_same_base(up.first));

        // Case insensitive string conversion caps
        precise_measurement case_insensitive_plural_caps =
            measurement_from_string(plural_caps, case_insensitive);
        // true
        EXPECT_TRUE(
            case_insensitive_plural_caps.units().has_same_base(up.first));

        units::precise_measurement case_insensitive_singular_caps =
            measurement_from_string(singular_caps, case_insensitive);
        // false
        EXPECT_TRUE(
            case_insensitive_singular_caps.units().has_same_base(up.first));

        // Round trip
        const std::string case_insensitive_plural_str =
            units::to_string(case_insensitive_plural);
        units::precise_measurement round_trip = units::measurement_from_string(
            case_insensitive_plural_str, units::case_insensitive);
        EXPECT_TRUE(round_trip.units().has_same_base(up.first));
    }
}